

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFPageInput.cpp
# Opt level: O0

void __thiscall
PDFPageInput::PDFPageInput
          (PDFPageInput *this,PDFParser *inParser,RefCountPtr<PDFDictionary> *inPageObject)

{
  PDFDictionary *inValue;
  RefCountPtr<PDFDictionary> *inPageObject_local;
  PDFParser *inParser_local;
  PDFPageInput *this_local;
  
  PDFObjectCastPtr<PDFDictionary>::PDFObjectCastPtr(&this->mPageObject);
  this->mParser = inParser;
  inValue = RefCountPtr<PDFDictionary>::GetPtr(inPageObject);
  PDFObjectCastPtr<PDFDictionary>::operator=(&this->mPageObject,&inValue->super_PDFObject);
  AssertPageObjectValid(this);
  return;
}

Assistant:

PDFPageInput::PDFPageInput(PDFParser* inParser,const RefCountPtr<PDFDictionary>& inPageObject)
{
    mParser = inParser;
    mPageObject = inPageObject.GetPtr();
    AssertPageObjectValid();
}